

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::tracker_manager::remove_request(tracker_manager *this,http_tracker_connection *c)

{
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar1;
  _Map_pointer ppsVar2;
  _Elt_pointer psVar3;
  iterator __position;
  shared_ptr<libtorrent::aux::http_tracker_connection> *psVar4;
  long lVar5;
  _Elt_pointer psVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  iterator local_58;
  iterator local_38;
  
  __position._M_current =
       (this->m_http_conns).
       super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_http_conns).
           super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)psVar1 - (long)__position._M_current;
  if (0 < (long)uVar7 >> 6) {
    psVar4 = (shared_ptr<libtorrent::aux::http_tracker_connection> *)
             ((long)&((__position._M_current)->
                     super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + (uVar7 & 0xffffffffffffffc0));
    lVar5 = ((long)uVar7 >> 6) + 1;
    __position._M_current = __position._M_current + 2;
    do {
      if (__position._M_current[-2].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + -2;
        goto LAB_00370504;
      }
      if (__position._M_current[-1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + -1;
        goto LAB_00370504;
      }
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370504;
      if (__position._M_current[1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00370504;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
    uVar7 = (long)psVar1 - (long)psVar4;
    __position._M_current = psVar4;
  }
  lVar5 = (long)uVar7 >> 4;
  if (lVar5 == 1) {
LAB_003704e8:
    if (((__position._M_current)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr != c) {
      __position._M_current = psVar1;
    }
LAB_00370504:
    if (__position._M_current != psVar1) {
      ::std::
      vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::_M_erase(&this->m_http_conns,__position);
      psVar6 = (this->m_queued).
               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->m_queued).
          super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar6) {
        return;
      }
      local_58._M_cur =
           (_Elt_pointer)
           (psVar6->
           super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
      local_58._M_first =
           (_Elt_pointer)
           (psVar6->
           super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
      (psVar6->
      super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar6->
      super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      ::std::
      deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
      ::pop_front(&this->m_queued);
      ::std::
      vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
      ::emplace_back<std::shared_ptr<libtorrent::aux::http_tracker_connection>>
                ((vector<std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>>>
                  *)&this->m_http_conns,
                 (shared_ptr<libtorrent::aux::http_tracker_connection> *)&local_58);
      (*(((this->m_http_conns).
          super__Vector_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[3])();
      ppsVar2 = (this->m_queued).
                super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      counters::set_value(this->m_stats_counters,0x122,
                          ((long)(this->m_queued).
                                 super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)(this->m_queued).
                                 super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                          ((long)(this->m_queued).
                                 super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(this->m_queued).
                                 super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                          ((((ulong)((long)ppsVar2 -
                                    (long)(this->m_queued).
                                          super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                           1) + (ulong)(ppsVar2 == (_Map_pointer)0x0)) * 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_first ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_first);
      return;
    }
  }
  else {
    if (lVar5 == 2) {
LAB_003704df:
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr != c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_003704e8;
      }
      goto LAB_00370504;
    }
    if (lVar5 == 3) {
      if (((__position._M_current)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr != c) {
        __position._M_current = __position._M_current + 1;
        goto LAB_003704df;
      }
      goto LAB_00370504;
    }
  }
  local_58._M_cur =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar6 = (this->m_queued).
           super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_58._M_node =
       (this->m_queued).
       super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  psVar3 = (this->m_queued).
           super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppsVar2 = (this->m_queued).
            super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar5 = (((ulong)((long)ppsVar2 - (long)local_58._M_node) >> 3) -
          (ulong)(ppsVar2 != (_Map_pointer)0x0)) * 0x20;
  lVar8 = (long)psVar3 -
          (long)(this->m_queued).
                super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
  lVar10 = ((long)psVar6 - (long)local_58._M_cur >> 4) + lVar8;
  lVar9 = lVar5 + lVar10 >> 2;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370738;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar6) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar6 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370738;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar6) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar6 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370738;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar6) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar6 = local_58._M_cur + 0x20;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370738;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar6) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar6 = local_58._M_cur + 0x20;
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
    lVar5 = (((ulong)((long)ppsVar2 - (long)local_58._M_node) >> 3) -
            (ulong)(ppsVar2 != (_Map_pointer)0x0)) * 0x20;
    lVar10 = ((long)psVar6 - (long)local_58._M_cur >> 4) + lVar8;
  }
  lVar10 = lVar10 + lVar5;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      if (lVar10 != 3) {
        return;
      }
      if (((local_58._M_cur)->
          super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == c) goto LAB_00370738;
      local_58._M_cur = local_58._M_cur + 1;
      if (local_58._M_cur == psVar6) {
        local_58._M_cur = local_58._M_node[1];
        local_58._M_node = local_58._M_node + 1;
        psVar6 = local_58._M_cur + 0x20;
      }
    }
    if (((local_58._M_cur)->
        super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == c) goto LAB_00370738;
    local_58._M_cur = local_58._M_cur + 1;
    if (local_58._M_cur == psVar6) {
      local_58._M_cur = local_58._M_node[1];
      local_58._M_node = local_58._M_node + 1;
    }
  }
  if (((local_58._M_cur)->
      super___shared_ptr<libtorrent::aux::http_tracker_connection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != c) {
    return;
  }
LAB_00370738:
  if (local_58._M_cur != psVar3) {
    local_58._M_first = *local_58._M_node;
    local_58._M_last = local_58._M_first + 0x20;
    ::std::
    deque<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
    ::_M_erase(&local_38,&this->m_queued,&local_58);
    ppsVar2 = (this->m_queued).
              super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    counters::set_value(this->m_stats_counters,0x122,
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                        ((long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_queued).
                               super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                        ((((ulong)((long)ppsVar2 -
                                  (long)(this->m_queued).
                                        super__Deque_base<std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::http_tracker_connection>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                        + (ulong)(ppsVar2 == (_Map_pointer)0x0)) * 0x20);
  }
  return;
}

Assistant:

void tracker_manager::remove_request(aux::http_tracker_connection const* c)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_http_conns.begin(), m_http_conns.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (i != m_http_conns.end())
		{
			m_http_conns.erase(i);
			if (!m_queued.empty())
			{
				auto conn = std::move(m_queued.front());
				m_queued.pop_front();
				m_http_conns.push_back(std::move(conn));
				m_http_conns.back()->start();
				m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
			}
			return;
		}

		auto const j = std::find_if(m_queued.begin(), m_queued.end()
			, [c] (std::shared_ptr<aux::http_tracker_connection> const& ptr) { return ptr.get() == c; });
		if (j != m_queued.end())
		{
			m_queued.erase(j);
			m_stats_counters.set_value(counters::num_queued_tracker_announces, std::int64_t(m_queued.size()));
		}
	}